

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getShaderFlagStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkShaderStageFlagBits shader,
          bool isDescription)

{
  int iVar1;
  char *pcVar2;
  string *psVar3;
  long lVar4;
  char cVar5;
  char *pcVar6;
  ostringstream desc;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  lVar4 = 0x15;
  pcVar6 = "unknown shader stage!";
  iVar1 = (int)this;
  cVar5 = (char)shader;
  switch(iVar1) {
  case 1:
    pcVar6 = "vertex_stage";
    if (cVar5 != '\0') {
      pcVar6 = "vertex stage";
    }
    lVar4 = 0xc;
    break;
  case 2:
    pcVar6 = "tessellation_control_stage";
    if (cVar5 != '\0') {
      pcVar6 = "tessellation control stage";
    }
    lVar4 = 0x1a;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 4:
    pcVar6 = "tessellation_evaluation_stage";
    if (cVar5 != '\0') {
      pcVar6 = "tessellation evaluation stage";
    }
    lVar4 = 0x1d;
    break;
  case 8:
    pcVar2 = "geometry stage";
    pcVar6 = "geometry_stage";
    goto LAB_00473aec;
  default:
    if (iVar1 != 0x10) {
      if (iVar1 == 0x20) {
        pcVar6 = "compute_stage";
        if (cVar5 != '\0') {
          pcVar6 = "compute stage";
        }
        lVar4 = 0xd;
      }
      break;
    }
    pcVar2 = "fragment stage";
    pcVar6 = "fragment_stage";
LAB_00473aec:
    if (cVar5 != '\0') {
      pcVar6 = pcVar2;
    }
    lVar4 = 0xe;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar6,lVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  psVar3 = (string *)std::ios_base::~ios_base(local_120);
  return psVar3;
}

Assistant:

std::string getShaderFlagStr (const VkShaderStageFlagBits shader,
							  bool                        isDescription)
{
	std::ostringstream desc;
	switch(shader)
	{
		case VK_SHADER_STAGE_VERTEX_BIT:
		{
			desc << ((isDescription) ? "vertex stage" : "vertex_stage");
			break;
		}
		case VK_SHADER_STAGE_FRAGMENT_BIT:
		{
			desc << ((isDescription) ? "fragment stage" : "fragment_stage");
			break;
		}
		case VK_SHADER_STAGE_GEOMETRY_BIT:
		{
			desc << ((isDescription) ? "geometry stage" : "geometry_stage");
			break;
		}
		case VK_SHADER_STAGE_COMPUTE_BIT:
		{
			desc << ((isDescription) ? "compute stage" : "compute_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		{
			desc << ((isDescription) ? "tessellation control stage" : "tessellation_control_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
		{
			desc << ((isDescription) ? "tessellation evaluation stage" : "tessellation_evaluation_stage");
			break;
		}
	  default:
		desc << "unknown shader stage!";
		DE_FATAL("Unknown shader Stage!");
		break;
	};

	return desc.str();
}